

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_FloodZone(sector_t_conflict *sec,int zonenum)

{
  line_t_conflict *plVar1;
  sector_t_conflict *local_28;
  sector_t_conflict *other;
  line_t_conflict *check;
  int i;
  int zonenum_local;
  sector_t_conflict *sec_local;
  
  if ((uint)sec->ZoneNumber != zonenum) {
    sec->ZoneNumber = (WORD)zonenum;
    for (check._0_4_ = 0; (int)check < sec->linecount; check._0_4_ = (int)check + 1) {
      plVar1 = sec->lines[(int)check];
      if ((plVar1->sidedef[1] != (side_t *)0x0) && ((plVar1->flags & 0x10000) == 0)) {
        if (plVar1->frontsector == sec) {
          if (plVar1->backsector == (sector_t_conflict *)0x0) {
            __assert_fail("check->backsector != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_setup.cpp"
                          ,0x31b,"void P_FloodZone(sector_t *, int)");
          }
          local_28 = plVar1->backsector;
        }
        else {
          if (plVar1->frontsector == (sector_t_conflict *)0x0) {
            __assert_fail("check->frontsector != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_setup.cpp"
                          ,800,"void P_FloodZone(sector_t *, int)");
          }
          local_28 = plVar1->frontsector;
        }
        if ((uint)local_28->ZoneNumber != zonenum) {
          P_FloodZone(local_28,zonenum);
        }
      }
    }
  }
  return;
}

Assistant:

void P_FloodZone (sector_t *sec, int zonenum)
{
	int i;

	if (sec->ZoneNumber == zonenum)
		return;

	sec->ZoneNumber = zonenum;

	for (i = 0; i < sec->linecount; ++i)
	{
		line_t *check = sec->lines[i];
		sector_t *other;

		if (check->sidedef[1] == NULL || (check->flags & ML_ZONEBOUNDARY))
			continue;

		if (check->frontsector == sec)
		{
			assert(check->backsector != NULL);
			other = check->backsector;
		}
		else
		{
			assert(check->frontsector != NULL);
			other = check->frontsector;
		}

		if (other->ZoneNumber != zonenum)
			P_FloodZone (other, zonenum);
	}
}